

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lda_c_2d_prm.c
# Opt level: O0

void N_set_ext_params(xc_func_type *p,double *ext_params)

{
  double *pdVar1;
  double *in_RSI;
  xc_func_type *in_RDI;
  double dVar2;
  double dVar3;
  double dx2;
  double dx;
  double N;
  lda_x_params *params;
  
  pdVar1 = (double *)in_RDI->params;
  dVar2 = get_ext_param(in_RDI,in_RSI,0);
  dVar2 = cbrt(dVar2 * 4.0);
  dVar2 = 1.0 / dVar2;
  dVar3 = dVar2 * dVar2;
  *pdVar1 = (dVar3 + dVar3 + dVar2 * -2.6666666666666665 + 1.0) - (dVar3 * dVar3) / 3.0;
  return;
}

Assistant:

static void
N_set_ext_params(xc_func_type *p, const double *ext_params)
{
  static double prm_q = 3.9274; /* 2.258 */
  lda_c_2d_prm_params *params;

  assert(p != NULL && p->params != NULL);
  params = (lda_c_2d_prm_params *) (p->params);

  params->N = get_ext_param(p, ext_params, 0);

  if(params->N <= 1.0){
    fprintf(stderr, "PRM functional cannot be used for N_electrons <= 1\n");
    exit(1);
  }

  params->c = M_PI/(2.0*(params->N - 1.0)*prm_q*prm_q); /* Eq. (13) */
}